

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcesdialog.cpp
# Opt level: O2

void __thiscall FSSSourcesDialog::add_source(FSSSourcesDialog *this,PSource *source)

{
  QFormLayout *pQVar1;
  int iVar2;
  DataSourceType DVar3;
  QHBoxLayout *this_00;
  QLabel *pQVar4;
  QPathEdit *this_01;
  char *ch;
  char *local_90 [4];
  QArrayDataPointer<char16_t> local_70;
  __shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2> local_58;
  QArrayDataPointer<char16_t> local_48;
  
  this_00 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_00);
  pQVar1 = this->layout;
  (**((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source)
            (local_90);
  QString::QString((QString *)&local_70,local_90[0]);
  QFormLayout::addRow((QString *)pQVar1,(QLayout *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  std::__cxx11::string::~string((string *)local_90);
  pQVar4 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar4,this,0);
  iVar2 = (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Source[2])();
  ch = ":/icons/Actions-edit-delete-icon.png";
  if ((char)iVar2 != '\0') {
    ch = ":/icons/Actions-dialog-ok-apply-icon.png";
  }
  QString::QString((QString *)&local_70,ch);
  QPixmap::QPixmap((QPixmap *)local_90,&local_70,0,0);
  QLabel::setPixmap((QPixmap *)pQVar4);
  QPixmap::~QPixmap((QPixmap *)local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QBoxLayout::addWidget(this_00,pQVar4,0,0);
  this_01 = (QPathEdit *)operator_new(0xb0);
  QPathEdit::QPathEdit(this_01,(QWidget *)this,SeperatedButton);
  std::__shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>);
  DVar3 = FSSDataModel::getType((PSource *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  QPathEdit::setPathMode(this_01,(uint)(DVar3 != DataSourceTypeDos));
  (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source[1]
  )(local_90);
  QString::QString((QString *)&local_48,local_90[0]);
  QPathEdit::setPath(this_01,(QString *)&local_48,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  std::__cxx11::string::~string((string *)local_90);
  QBoxLayout::addWidget(this_00,this_01,0,0);
  return;
}

Assistant:

void
FSSSourcesDialog::add_source(Data::PSource source) {
  QHBoxLayout *line_layout = new QHBoxLayout();
  layout->addRow(source->get_name().c_str(), line_layout);

  QLabel *label = new QLabel(this);
  label->setPixmap(QPixmap(source->is_loaded() ?
                           ":/icons/Actions-dialog-ok-apply-icon.png" :
                           ":/icons/Actions-edit-delete-icon.png"));
  line_layout->addWidget(label);

  QPathEdit *path_edit = new QPathEdit(this);
  FSSDataModel::DataSourceType type = FSSDataModel::getType(source);
  path_edit->setPathMode((type == FSSDataModel::DataSourceTypeDos) ?
                         QPathEdit::ExistingFile :
                         QPathEdit::ExistingFolder);
  path_edit->setPath(source->get_path().c_str());
  line_layout->addWidget(path_edit);
}